

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O1

Var Js::DataView::EntryGetterByteOffset(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  ScriptContext *pSVar2;
  ArrayBufferBase *pAVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  Var pvVar7;
  DataView *pDVar8;
  uint64 uVar9;
  uint64 uVar10;
  undefined1 *puVar11;
  int32 hCode;
  double value;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x2d2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b490b8;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x2d5,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00b490b8;
    *puVar6 = 0;
  }
  if (((ulong)local_38 & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)local_38,0);
    bVar5 = VarIs<Js::DataView>(pvVar7);
    if (bVar5) {
      pvVar7 = Arguments::operator[]((Arguments *)local_38,0);
      pDVar8 = VarTo<Js::DataView>(pvVar7);
      pAVar3 = (pDVar8->super_ArrayBufferParent).arrayBuffer.ptr;
      if (pAVar3 != (ArrayBufferBase *)0x0) {
        puVar11 = &DAT_1000000000000;
        if (pAVar3->isDetached == false) {
          uVar1 = pDVar8->byteOffset;
          if ((long)(int)uVar1 < 0) {
            value = (double)uVar1;
            uVar9 = NumberUtilities::ToSpecial(value);
            bVar5 = NumberUtilities::IsNan(value);
            if (bVar5) {
              uVar10 = NumberUtilities::ToSpecial(value);
              if (uVar10 != 0xfff8000000000000) {
                uVar10 = NumberUtilities::ToSpecial(value);
                if (uVar10 != 0x7ff8000000000000) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar6 = 1;
                  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                              ,0xa2,
                                              "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                              ,"We should only produce a NaN with this value");
                  if (!bVar5) {
LAB_00b490b8:
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  *puVar6 = 0;
                }
              }
            }
            puVar11 = (undefined1 *)(uVar9 ^ 0xfffc000000000000);
          }
          else {
            puVar11 = (undefined1 *)((long)(int)uVar1 | 0x1000000000000);
          }
        }
        return puVar11;
      }
      hCode = -0x7ff5ea1c;
      goto LAB_00b490c2;
    }
  }
  hCode = -0x7ff5ec21;
LAB_00b490c2:
  JavascriptError::ThrowTypeError(pSVar2,hCode,(PCWSTR)0x0);
}

Assistant:

Var DataView::EntryGetterByteOffset(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<DataView>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
        }

        DataView* dataView = VarTo<DataView>(args[0]);
        ArrayBufferBase* arrayBuffer = dataView->GetArrayBuffer();

        if (arrayBuffer == nullptr)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject);
        }
        else if (arrayBuffer->IsDetached())
        {
            return TaggedInt::ToVarUnchecked(0);
        }

        return JavascriptNumber::ToVar(dataView->GetByteOffset(), scriptContext);
    }